

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

_Bool ARM_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  DecodeStatus DVar1;
  DecodeStatus status;
  uint64_t address_local;
  uint16_t *size_local;
  MCInst *instr_local;
  size_t code_len_local;
  uint8_t *code_local;
  csh ud_local;
  
  DVar1 = _ARM_getInstruction((cs_struct *)ud,instr,code,code_len,size,address);
  return DVar1 != MCDisassembler_Fail;
}

Assistant:

bool ARM_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _ARM_getInstruction((cs_struct *)ud, instr, code, code_len, size, address);

	//return status == MCDisassembler_Success;
	return status != MCDisassembler_Fail;
}